

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O0

void __thiscall
Iir::Butterworth::BandPassBase::setup
          (BandPassBase *this,int order,double centerFrequency,double widthFrequency)

{
  undefined8 in_RDI;
  Cascade *in_XMM1_Qa;
  AnalogLowPass *unaff_retaddr;
  LayoutBase *in_stack_000000a0;
  LayoutBase *in_stack_000000a8;
  double in_stack_000000b0;
  double in_stack_000000b8;
  BandPassTransform *in_stack_000000c0;
  LayoutBase *in_stack_ffffffffffffffd8;
  
  AnalogLowPass::design(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  BandPassTransform::BandPassTransform
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             in_stack_000000a0);
  Cascade::setLayout(in_XMM1_Qa,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void BandPassBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency)
{
  m_analogProto.design (order);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}